

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O2

void __thiscall
cmSearchPath::AddSuffixes
          (cmSearchPath *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *suffixes)

{
  vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_> *this_00;
  pointer pPVar1;
  pointer pbVar2;
  pointer __args;
  pointer __rhs;
  string p;
  vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [64];
  
  this_00 = &this->Paths;
  __args = (this->Paths).
           super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this->Paths).
           super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a8.
  super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->Paths).
       super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->Paths).
  super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Paths).
  super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Paths).
  super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>.
  _M_impl.super__Vector_impl_data._M_start = __args;
  local_a8.
  super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>.
  _M_impl.super__Vector_impl_data._M_finish = pPVar1;
  std::vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>::reserve
            (this_00,(((long)(suffixes->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(suffixes->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5) + 1) *
                     ((long)pPVar1 - (long)__args >> 6));
  for (; __args != pPVar1; __args = __args + 1) {
    cmsys::SystemTools::ConvertToUnixSlashes(&__args->Path);
    cmsys::SystemTools::ConvertToUnixSlashes(&__args->Prefix);
    std::__cxx11::string::string((string *)&local_90,(string *)__args);
    if ((local_90._M_string_length != 0) &&
       (local_90._M_dataplus._M_p[local_90._M_string_length - 1] != '/')) {
      std::__cxx11::string::append((char *)&local_90);
    }
    pbVar2 = (suffixes->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (__rhs = (suffixes->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar2; __rhs = __rhs + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     &local_90,__rhs);
      std::__cxx11::string::string((string *)(local_70 + 0x20),(string *)&__args->Prefix);
      std::vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>::
      emplace_back<cmSearchPath::PathWithPrefix>(this_00,(PathWithPrefix *)local_70);
      PathWithPrefix::~PathWithPrefix((PathWithPrefix *)local_70);
    }
    std::vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>::
    emplace_back<cmSearchPath::PathWithPrefix>(this_00,__args);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>::~vector
            (&local_a8);
  return;
}

Assistant:

void cmSearchPath::AddSuffixes(const std::vector<std::string>& suffixes)
{
  std::vector<PathWithPrefix> inPaths;
  inPaths.swap(this->Paths);
  this->Paths.reserve(inPaths.size() * (suffixes.size() + 1));

  for (PathWithPrefix& inPath : inPaths) {
    cmSystemTools::ConvertToUnixSlashes(inPath.Path);
    cmSystemTools::ConvertToUnixSlashes(inPath.Prefix);

    // if *i is only / then do not add a //
    // this will get incorrectly considered a network
    // path on windows and cause huge delays.
    std::string p = inPath.Path;
    if (!p.empty() && p.back() != '/') {
      p += "/";
    }

    // Combine with all the suffixes
    for (std::string const& suffix : suffixes) {
      this->Paths.push_back(PathWithPrefix{ p + suffix, inPath.Prefix });
    }

    // And now the original w/o any suffix
    this->Paths.push_back(std::move(inPath));
  }
}